

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::GPUShaderFP64Test2::iterate(GPUShaderFP64Test2 *this)

{
  shaderStage shader_stage_00;
  bool bVar1;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  reference psVar2;
  reference uniform_type_00;
  TestContext *pTVar3;
  __normal_iterator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails_*,_std::vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>_>
  local_80;
  __normal_iterator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails_*,_std::vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>_>
  local_78;
  __normal_iterator<const_gl4cts::GPUShaderFP64Test2::uniformTypeDetails_*,_std::vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>_>
  local_70;
  const_iterator uniform_type;
  __normal_iterator<gl4cts::GPUShaderFP64Test2::shaderStage_*,_std::vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>_>
  local_60;
  __normal_iterator<const_gl4cts::GPUShaderFP64Test2::shaderStage_*,_std::vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>_>
  local_58;
  const_iterator shader_stage;
  allocator<char> local_39;
  string local_38;
  byte local_11;
  GPUShaderFP64Test2 *pGStack_10;
  bool result;
  GPUShaderFP64Test2 *this_local;
  
  local_11 = 1;
  pGStack_10 = this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_gpu_shader_fp64");
  if (!bVar1) {
    shader_stage._M_current._3_1_ = 1;
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_ARB_gpu_shader_fp64 is not supported",&local_39);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_38);
    shader_stage._M_current._3_1_ = 0;
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  testInit(this);
  prepareShaderStages(this);
  prepareUniformTypes(this);
  local_60._M_current =
       (shaderStage *)
       std::
       vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
       ::begin(&this->m_shader_stages);
  __gnu_cxx::
  __normal_iterator<gl4cts::GPUShaderFP64Test2::shaderStage_const*,std::vector<gl4cts::GPUShaderFP64Test2::shaderStage,std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>>>
  ::__normal_iterator<gl4cts::GPUShaderFP64Test2::shaderStage*>
            ((__normal_iterator<gl4cts::GPUShaderFP64Test2::shaderStage_const*,std::vector<gl4cts::GPUShaderFP64Test2::shaderStage,std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>>>
              *)&local_58,&local_60);
  while( true ) {
    uniform_type._M_current =
         (uniformTypeDetails *)
         std::
         vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
         ::end(&this->m_shader_stages);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<gl4cts::GPUShaderFP64Test2::shaderStage_*,_std::vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>_>
                        *)&uniform_type,&local_58);
    if (!bVar1) break;
    local_78._M_current =
         (uniformTypeDetails *)
         std::
         vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
         ::begin(&this->m_uniform_types);
    __gnu_cxx::
    __normal_iterator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails_const*,std::vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>>>
    ::__normal_iterator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails*>
              ((__normal_iterator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails_const*,std::vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>>>
                *)&local_70,&local_78);
    while( true ) {
      local_80._M_current =
           (uniformTypeDetails *)
           std::
           vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
           ::end(&this->m_uniform_types);
      bVar1 = __gnu_cxx::operator!=(&local_80,&local_70);
      if (!bVar1) break;
      psVar2 = __gnu_cxx::
               __normal_iterator<const_gl4cts::GPUShaderFP64Test2::shaderStage_*,_std::vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>_>
               ::operator*(&local_58);
      shader_stage_00 = *psVar2;
      uniform_type_00 =
           __gnu_cxx::
           __normal_iterator<const_gl4cts::GPUShaderFP64Test2::uniformTypeDetails_*,_std::vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>_>
           ::operator*(&local_70);
      bVar1 = test(this,shader_stage_00,uniform_type_00);
      if (!bVar1) {
        local_11 = 0;
      }
      __gnu_cxx::
      __normal_iterator<const_gl4cts::GPUShaderFP64Test2::uniformTypeDetails_*,_std::vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>_>
      ::operator++(&local_70);
    }
    __gnu_cxx::
    __normal_iterator<const_gl4cts::GPUShaderFP64Test2::shaderStage_*,_std::vector<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>_>
    ::operator++(&local_58);
  }
  if ((local_11 & 1) == 1) {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test2::iterate()
{
	bool result = true;

	/* Check if extension is supported */
	if (false == m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported");
	}

	/* Initialize test */
	testInit();

	prepareShaderStages();
	prepareUniformTypes();

	/* For all shaders and uniform type combinations */
	for (std::vector<shaderStage>::const_iterator shader_stage = m_shader_stages.begin();
		 m_shader_stages.end() != shader_stage; ++shader_stage)
	{
		for (std::vector<uniformTypeDetails>::const_iterator uniform_type = m_uniform_types.begin();
			 m_uniform_types.end() != uniform_type; ++uniform_type)
		{
			/* Execute test */
			if (false == test(*shader_stage, *uniform_type))
			{
				result = false;
			}
		}
	}

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}